

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O0

void __thiscall CWire::AssignLayer(CWire *this,int iLayer)

{
  int iVar1;
  int iVar2;
  CLayer *pCVar3;
  CNet *this_00;
  CDesign *pCVar4;
  CGrid *pCVar5;
  bool bVar6;
  CNet *pNet;
  int iLayer_local;
  CWire *this_local;
  
  iVar1 = IsRouted(this);
  if (iVar1 == 0) {
    pCVar4 = CObject::GetDesign();
    pCVar3 = CDesign::GetLayer(pCVar4,iLayer);
    iVar1 = CPoint::X(this->m_pPointS);
    iVar2 = CPoint::Y(this->m_pPointS);
    pCVar5 = CLayer::GetGrid(pCVar3,iVar1,iVar2);
    this->m_pPointS = (CPoint *)pCVar5;
    pCVar4 = CObject::GetDesign();
    pCVar3 = CDesign::GetLayer(pCVar4,iLayer);
    iVar1 = CPoint::X(this->m_pPointE);
    iVar2 = CPoint::Y(this->m_pPointE);
    pCVar5 = CLayer::GetGrid(pCVar3,iVar1,iVar2);
    this->m_pPointE = (CPoint *)pCVar5;
    CreateKey(this);
    return;
  }
  iVar1 = IsLayerAssigned(this);
  if (iVar1 != 0) {
    pCVar3 = GetLayer(this);
    bVar6 = true;
    if (pCVar3 != (CLayer *)0x0) goto LAB_00146bba;
  }
  iVar1 = IsLayerAssigned(this);
  bVar6 = false;
  if (iVar1 == 0) {
    pCVar3 = GetLayer(this);
    bVar6 = pCVar3 == (CLayer *)0x0;
  }
LAB_00146bba:
  if (!bVar6) {
    __assert_fail("(IsLayerAssigned()&&GetLayer())||(!IsLayerAssigned()&&!GetLayer())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x121,"void CWire::AssignLayer(int)");
  }
  iVar1 = IsLayerAssigned(this);
  if (iVar1 != 0) {
    pCVar3 = GetLayer(this);
    iVar1 = CLayer::Z(pCVar3);
    if (iVar1 == iLayer) {
      return;
    }
  }
  this_00 = GetParent(this);
  if (this_00 != (CNet *)0x0) {
    CNet::DelWire(this_00,this,0);
    pCVar4 = CObject::GetDesign();
    pCVar3 = CDesign::GetLayer(pCVar4,iLayer);
    iVar1 = CPoint::X(this->m_pPointS);
    iVar2 = CPoint::Y(this->m_pPointS);
    pCVar5 = CLayer::GetGrid(pCVar3,iVar1,iVar2);
    this->m_pPointS = (CPoint *)pCVar5;
    pCVar4 = CObject::GetDesign();
    pCVar3 = CDesign::GetLayer(pCVar4,iLayer);
    iVar1 = CPoint::X(this->m_pPointE);
    iVar2 = CPoint::Y(this->m_pPointE);
    pCVar5 = CLayer::GetGrid(pCVar3,iVar1,iVar2);
    this->m_pPointE = (CPoint *)pCVar5;
    CreateKey(this);
    if (iLayer == 0) {
      SetState(this,8);
    }
    else {
      SetState(this,4);
    }
    CNet::AddWire(this_00,this);
    return;
  }
  __assert_fail("pNet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                ,0x126,"void CWire::AssignLayer(int)");
}

Assistant:

void CWire::AssignLayer(int iLayer)
{
	if(IsRouted())
	{
		assert((IsLayerAssigned()&&GetLayer())||(!IsLayerAssigned()&&!GetLayer()));
		
		if(IsLayerAssigned()&&GetLayer()->Z()==iLayer)	return;
		
		CNet*	pNet	=	GetParent();
		assert(pNet);
		
		pNet->DelWire(this);
		
		m_pPointS	=	GetDesign()->GetLayer(iLayer)->GetGrid(m_pPointS->X(),m_pPointS->Y());
		m_pPointE	=	GetDesign()->GetLayer(iLayer)->GetGrid(m_pPointE->X(),m_pPointE->Y());
		//m_pPointS->SetZ(iLayer);
		//m_pPointE->SetZ(iLayer);
		CreateKey();	
		
		iLayer?	SetState(STATE_WIRE_ASSGNED):SetState(STATE_WIRE_NOTASSGNED);
		
		pNet->AddWire(this);
	}
	else
	{
		m_pPointS	=	GetDesign()->GetLayer(iLayer)->GetGrid(m_pPointS->X(),m_pPointS->Y());
		m_pPointE	=	GetDesign()->GetLayer(iLayer)->GetGrid(m_pPointE->X(),m_pPointE->Y());
		//m_pPointS->SetZ(iLayer);
		//m_pPointE->SetZ(iLayer);
		
		CreateKey();
	}
}